

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall Equality_resetNotEqualById_Test::TestBody(Equality_resetNotEqualById_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  ResetPtr r2;
  ResetPtr r1;
  long *local_70;
  AssertHelper local_68 [8];
  AssertionResult local_60;
  long local_50 [2];
  byte local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  shared_ptr *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  createInitialisedReset();
  createInitialisedReset();
  psVar1 = local_30;
  local_60._0_8_ = (string *)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"id","");
  libcellml::Entity::setId(psVar1);
  if ((string *)local_60._0_8_ != (string *)local_50) {
    operator_delete((void *)local_60._0_8_,local_50[0] + 1);
  }
  local_60._0_8_ = local_30;
  local_60.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  local_40[0] = libcellml::Entity::equals(local_20);
  local_40[0] = local_40[0] ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.message_.ptr_);
  }
  if (local_40[0] == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)local_40,"r1->equals(r2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x1d9,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((string *)local_60._0_8_ != (string *)local_50) {
      operator_delete((void *)local_60._0_8_,local_50[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60._0_8_ = local_20;
  local_60.message_.ptr_ = local_18;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
    }
  }
  local_40[0] = libcellml::Entity::equals((shared_ptr *)local_30);
  local_40[0] = local_40[0] ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.message_.ptr_);
  }
  if (local_40[0] == 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(char *)local_40,"r2->equals(r1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x1da,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((string *)local_60._0_8_ != (string *)local_50) {
      operator_delete((void *)local_60._0_8_,local_50[0] + 1);
    }
    if (local_70 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_70 != (long *)0x0)) {
        (**(code **)(*local_70 + 8))();
      }
      local_70 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return;
}

Assistant:

TEST(Equality, resetNotEqualById)
{
    libcellml::ResetPtr r1 = createInitialisedReset();
    libcellml::ResetPtr r2 = createInitialisedReset();

    r2->setId("id");

    EXPECT_FALSE(r1->equals(r2));
    EXPECT_FALSE(r2->equals(r1));
}